

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opextinst_forward_ref_fixup_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::OpExtInstWithForwardReferenceFixupPass::Process
          (OpExtInstWithForwardReferenceFixupPass *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Op OVar4;
  Status SVar5;
  reference puVar6;
  IRContext *this_00;
  FeatureManager *this_01;
  value_type *__x;
  value_type *__x_00;
  allocator<char> local_151;
  string local_150;
  undefined1 local_129;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *ppStack_128;
  bool hasForwardReferences;
  undefined1 local_114 [12];
  Instruction *inst;
  iterator __end2_1;
  iterator __begin2_1;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_1;
  IRContext *ctx;
  bool hasAtLeastOneForwardReference;
  bool moduleChanged;
  undefined1 local_bc [8];
  uint32_t id;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  undefined1 local_90 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  debug_ids;
  undefined1 local_48 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_ids;
  OpExtInstWithForwardReferenceFixupPass *this_local;
  
  seen_ids._M_h._M_single_bucket = (__node_base_ptr)this;
  Pass::get_module(&this->super_Pass);
  Module::ext_inst_imports((Module *)&debug_ids._M_h._M_single_bucket);
  anon_unknown_11::gatherResultIds
            ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_48,
             (IteratorRange<spvtools::opt::InstructionList::iterator> *)
             &debug_ids._M_h._M_single_bucket);
  Pass::get_module(&this->super_Pass);
  Module::ext_inst_debuginfo((Module *)&__range2);
  anon_unknown_11::gatherResultIds
            ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_90,(IteratorRange<spvtools::opt::InstructionList::iterator> *)&__range2);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_48);
  register0x00000000 =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_48);
  while (bVar2 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                            (_Node_iterator_base<unsigned_int,_false> *)(local_bc + 4)), bVar2) {
    puVar6 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    local_bc._0_4_ = *puVar6;
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)local_90,
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_bc,__x);
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  bVar1 = false;
  bVar2 = false;
  this_00 = Pass::context(&this->super_Pass);
  Pass::get_module(&this->super_Pass);
  Module::ext_inst_debuginfo((Module *)&__begin2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst);
  while (bVar3 = utils::operator!=(&__end2_1.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&inst), bVar3) {
    local_114._4_8_ =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(&__end2_1.super_iterator);
    OVar4 = opt::Instruction::opcode((Instruction *)local_114._4_8_);
    if ((OVar4 == OpExtInst) ||
       (OVar4 = opt::Instruction::opcode((Instruction *)local_114._4_8_),
       OVar4 == OpExtInstWithForwardRefsKHR)) {
      local_114._0_4_ = opt::Instruction::result_id((Instruction *)local_114._4_8_);
      ppStack_128 = std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *
                             )local_48,
                             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_114,__x_00);
      local_129 = anon_unknown_11::HasForwardReference
                            ((Instruction *)local_114._4_8_,
                             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_90,
                             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_48);
      bVar2 = bVar2 != false || (bool)local_129;
      bVar3 = anon_unknown_11::ReplaceOpcodeIfRequired
                        ((Instruction *)local_114._4_8_,(bool)local_129);
      if (bVar3) {
        bVar1 = true;
        IRContext::AnalyzeUses(this_00,(Instruction *)local_114._4_8_);
      }
    }
    InstructionList::iterator::operator++(&__end2_1);
  }
  this_01 = IRContext::get_feature_mgr(this_00);
  bVar3 = FeatureManager::HasExtension(this_01,kSPV_KHR_relaxed_extended_instruction);
  if (bVar2 != bVar3) {
    if (bVar2 == false) {
      IRContext::RemoveExtension(this_00,kSPV_KHR_relaxed_extended_instruction);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"SPV_KHR_relaxed_extended_instruction",&local_151);
      IRContext::AddExtension(this_00,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
    }
    bVar1 = true;
  }
  SVar5 = SuccessWithoutChange;
  if (bVar1) {
    SVar5 = SuccessWithChange;
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_90);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_48);
  return SVar5;
}

Assistant:

Pass::Status OpExtInstWithForwardReferenceFixupPass::Process() {
  std::unordered_set<uint32_t> seen_ids =
      gatherResultIds(get_module()->ext_inst_imports());
  std::unordered_set<uint32_t> debug_ids =
      gatherResultIds(get_module()->ext_inst_debuginfo());
  for (uint32_t id : seen_ids) debug_ids.insert(id);

  bool moduleChanged = false;
  bool hasAtLeastOneForwardReference = false;
  IRContext* ctx = context();
  for (Instruction& inst : get_module()->ext_inst_debuginfo()) {
    if (inst.opcode() != spv::Op::OpExtInst &&
        inst.opcode() != spv::Op::OpExtInstWithForwardRefsKHR)
      continue;

    seen_ids.insert(inst.result_id());
    bool hasForwardReferences = HasForwardReference(inst, debug_ids, seen_ids);
    hasAtLeastOneForwardReference |= hasForwardReferences;

    if (ReplaceOpcodeIfRequired(inst, hasForwardReferences)) {
      moduleChanged = true;
      ctx->AnalyzeUses(&inst);
    }
  }

  if (hasAtLeastOneForwardReference !=
      ctx->get_feature_mgr()->HasExtension(
          kSPV_KHR_relaxed_extended_instruction)) {
    if (hasAtLeastOneForwardReference)
      ctx->AddExtension("SPV_KHR_relaxed_extended_instruction");
    else
      ctx->RemoveExtension(Extension::kSPV_KHR_relaxed_extended_instruction);
    moduleChanged = true;
  }

  return moduleChanged ? Status::SuccessWithChange
                       : Status::SuccessWithoutChange;
}